

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi_00;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_NODE pRVar1;
  REF_SEARCH ref_search_00;
  uint uVar2;
  REF_LIST local_248;
  REF_LIST local_240;
  REF_LIST local_238;
  double local_230;
  REF_LIST local_220;
  int local_218;
  int local_214;
  int local_210;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT item;
  REF_INT i;
  REF_DBL *recv_bary;
  REF_DBL *send_bary;
  REF_INT *recv_node;
  REF_INT *send_node;
  REF_INT *recv_cell;
  REF_INT *send_cell;
  REF_INT *recv_proc;
  REF_INT *my_proc;
  REF_INT *send_proc;
  int local_160;
  REF_INT nrecv;
  REF_INT nsend;
  REF_INT total_node;
  REF_INT *source;
  REF_INT *global_node;
  REF_INT *local_node;
  REF_DBL *global_xyz;
  REF_DBL *local_xyz;
  int local_128;
  REF_INT stride;
  REF_INT seed_target;
  REF_INT ntarget;
  REF_DBL *best_bary;
  REF_INT *from_proc;
  REF_INT *best_cell;
  REF_INT *best_node;
  REF_INT local_f8;
  REF_INT node;
  REF_INT nodes [27];
  REF_LIST local_80;
  REF_LIST ref_list;
  REF_DBL bary [4];
  REF_SEARCH ref_search;
  REF_NODE to_node;
  REF_CELL from_tet;
  REF_NODE from_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_GRID from_grid;
  REF_INTERP ref_interp_local;
  
  ref_mpi_00 = ref_interp->ref_mpi;
  ref_node = ref_interp->from_grid->node;
  ref_cell = ref_interp->from_tet;
  pRVar1 = ref_interp->to_grid->node;
  ref_search_00 = ref_interp->ref_search;
  ref_interp_local._4_4_ = ref_list_create(&local_80);
  if (ref_interp_local._4_4_ == 0) {
    stride = 0;
    for (best_node._4_4_ = 0; best_node._4_4_ < pRVar1->max; best_node._4_4_ = best_node._4_4_ + 1)
    {
      if ((((-1 < best_node._4_4_) && (best_node._4_4_ < pRVar1->max)) &&
          (-1 < pRVar1->global[best_node._4_4_])) &&
         ((pRVar1->ref_mpi->id == pRVar1->part[best_node._4_4_] &&
          (ref_interp->cell[best_node._4_4_] == -1)))) {
        stride = stride + 1;
      }
    }
    if (stride < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x617,"ref_interp_seed_tree","malloc local_node of REF_INT negative");
      ref_interp_local._4_4_ = 1;
    }
    else {
      global_node = (REF_INT *)malloc((long)stride << 2);
      if (global_node == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x617,"ref_interp_seed_tree","malloc local_node of REF_INT NULL");
        ref_interp_local._4_4_ = 2;
      }
      else if (stride * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x618,"ref_interp_seed_tree","malloc local_xyz of REF_DBL negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        global_xyz = (REF_DBL *)malloc((long)(stride * 3) << 3);
        if (global_xyz == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x618,"ref_interp_seed_tree","malloc local_xyz of REF_DBL NULL");
          ref_interp_local._4_4_ = 2;
        }
        else {
          stride = 0;
          for (best_node._4_4_ = 0; best_node._4_4_ < pRVar1->max;
              best_node._4_4_ = best_node._4_4_ + 1) {
            if (((-1 < best_node._4_4_) && (best_node._4_4_ < pRVar1->max)) &&
               ((-1 < pRVar1->global[best_node._4_4_] &&
                ((pRVar1->ref_mpi->id == pRVar1->part[best_node._4_4_] &&
                 (ref_interp->cell[best_node._4_4_] == -1)))))) {
              global_node[stride] = best_node._4_4_;
              global_xyz[stride * 3] = pRVar1->real[best_node._4_4_ * 0xf];
              global_xyz[stride * 3 + 1] = pRVar1->real[best_node._4_4_ * 0xf + 1];
              global_xyz[stride * 3 + 2] = pRVar1->real[best_node._4_4_ * 0xf + 2];
              stride = stride + 1;
            }
          }
          local_210 = stride / 100;
          if (local_210 < 0xb) {
            local_210 = 10;
          }
          if (local_210 < 100) {
            local_214 = local_210;
          }
          else {
            local_214 = 100;
          }
          if (local_214 < stride) {
            local_218 = local_214;
          }
          else {
            local_218 = stride;
          }
          local_128 = local_218;
          if (0 < local_218) {
            local_xyz._4_4_ = stride / local_218 + 1;
            local_128 = 0;
            for (best_node._4_4_ = 0; best_node._4_4_ < stride;
                best_node._4_4_ = local_xyz._4_4_ + best_node._4_4_) {
              global_node[local_128] = global_node[best_node._4_4_];
              global_xyz[local_128 * 3] = global_xyz[best_node._4_4_ * 3];
              global_xyz[local_128 * 3 + 1] = global_xyz[best_node._4_4_ * 3 + 1];
              global_xyz[local_128 * 3 + 2] = global_xyz[best_node._4_4_ * 3 + 2];
              local_128 = local_128 + 1;
            }
            stride = local_128;
          }
          ref_interp_local._4_4_ =
               ref_mpi_allconcat(ref_mpi_00,3,stride,global_xyz,&nrecv,(REF_INT **)&nsend,
                                 &local_node,3);
          if (ref_interp_local._4_4_ == 0) {
            if (_nsend != (REF_INT *)0x0) {
              free(_nsend);
            }
            ref_interp_local._4_4_ =
                 ref_mpi_allconcat(ref_mpi_00,1,stride,global_node,&nrecv,(REF_INT **)&nsend,&source
                                   ,1);
            if (ref_interp_local._4_4_ == 0) {
              if (nrecv < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x63f,"ref_interp_seed_tree","malloc best_bary of REF_DBL negative");
                ref_interp_local._4_4_ = 1;
              }
              else {
                _seed_target = (REF_DBL *)malloc((long)nrecv << 3);
                if (_seed_target == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x63f,"ref_interp_seed_tree","malloc best_bary of REF_DBL NULL");
                  ref_interp_local._4_4_ = 2;
                }
                else if (nrecv < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x640,"ref_interp_seed_tree","malloc best_node of REF_INT negative");
                  ref_interp_local._4_4_ = 1;
                }
                else {
                  best_cell = (REF_INT *)malloc((long)nrecv << 2);
                  if (best_cell == (REF_INT *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x640,"ref_interp_seed_tree","malloc best_node of REF_INT NULL");
                    ref_interp_local._4_4_ = 2;
                  }
                  else if (nrecv < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x641,"ref_interp_seed_tree","malloc best_cell of REF_INT negative");
                    ref_interp_local._4_4_ = 1;
                  }
                  else {
                    from_proc = (REF_INT *)malloc((long)nrecv << 2);
                    if (from_proc == (REF_INT *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x641,"ref_interp_seed_tree","malloc best_cell of REF_INT NULL");
                      ref_interp_local._4_4_ = 2;
                    }
                    else if (nrecv < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x642,"ref_interp_seed_tree","malloc from_proc of REF_INT negative");
                      ref_interp_local._4_4_ = 1;
                    }
                    else {
                      best_bary = (REF_DBL *)malloc((long)nrecv << 2);
                      if (best_bary == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x642,"ref_interp_seed_tree","malloc from_proc of REF_INT NULL");
                        ref_interp_local._4_4_ = 2;
                      }
                      else {
                        for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                            best_node._4_4_ = best_node._4_4_ + 1) {
                          best_cell[best_node._4_4_] = source[best_node._4_4_];
                          from_proc[best_node._4_4_] = -1;
                          _seed_target[best_node._4_4_] = 1e+20;
                          uVar2 = ref_search_touching(ref_search_00,local_80,
                                                      (REF_DBL *)
                                                      (local_node + (long)(best_node._4_4_ * 3) * 2)
                                                      ,ref_interp->search_fuzz);
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x649,"ref_interp_seed_tree",(ulong)uVar2,"tch");
                            return uVar2;
                          }
                          if (local_80->n < 1) {
                            from_proc[best_node._4_4_] = -1;
                          }
                          else {
                            uVar2 = ref_interp_enclosing_tet_in_list
                                              (ref_interp,local_80,
                                               (REF_DBL *)
                                               (local_node + (long)(best_node._4_4_ * 3) * 2),
                                               from_proc + best_node._4_4_,(REF_DBL *)&ref_list);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x64e,"ref_interp_seed_tree",(ulong)uVar2,"best in list");
                              return uVar2;
                            }
                            if (from_proc[best_node._4_4_] != -1) {
                              if (bary[0] <= (double)ref_list) {
                                local_220 = (REF_LIST)bary[0];
                              }
                              else {
                                local_220 = ref_list;
                              }
                              if (bary[2] <= bary[1]) {
                                local_230 = bary[2];
                              }
                              else {
                                local_230 = bary[1];
                              }
                              if (local_230 <= (double)local_220) {
                                if (bary[2] <= bary[1]) {
                                  local_248 = (REF_LIST)bary[2];
                                }
                                else {
                                  local_248 = (REF_LIST)bary[1];
                                }
                                local_240 = local_248;
                              }
                              else {
                                if (bary[0] <= (double)ref_list) {
                                  local_238 = (REF_LIST)bary[0];
                                }
                                else {
                                  local_238 = ref_list;
                                }
                                local_240 = local_238;
                              }
                              _seed_target[best_node._4_4_] = -(double)local_240;
                            }
                          }
                          ref_interp->tree_cells = local_80->n + ref_interp->tree_cells;
                          uVar2 = ref_list_erase(local_80);
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x657,"ref_interp_seed_tree",(ulong)uVar2,"reset list");
                            return uVar2;
                          }
                        }
                        ref_interp_local._4_4_ =
                             ref_mpi_allminwho(ref_mpi_00,_seed_target,(REF_INT *)best_bary,nrecv);
                        if (ref_interp_local._4_4_ == 0) {
                          local_160 = 0;
                          for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                              best_node._4_4_ = best_node._4_4_ + 1) {
                            if (ref_mpi_00->id ==
                                *(int *)((long)best_bary + (long)best_node._4_4_ * 4)) {
                              local_160 = local_160 + 1;
                            }
                          }
                          if (local_160 * 4 < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x661,"ref_interp_seed_tree",
                                   "malloc send_bary of REF_DBL negative");
                            ref_interp_local._4_4_ = 1;
                          }
                          else {
                            recv_bary = (REF_DBL *)malloc((long)(local_160 << 2) << 3);
                            if (recv_bary == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x661,"ref_interp_seed_tree",
                                     "malloc send_bary of REF_DBL NULL");
                              ref_interp_local._4_4_ = 2;
                            }
                            else if (local_160 < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x662,"ref_interp_seed_tree",
                                     "malloc send_cell of REF_INT negative");
                              ref_interp_local._4_4_ = 1;
                            }
                            else {
                              recv_cell = (REF_INT *)malloc((long)local_160 << 2);
                              if (recv_cell == (REF_INT *)0x0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x662,"ref_interp_seed_tree",
                                       "malloc send_cell of REF_INT NULL");
                                ref_interp_local._4_4_ = 2;
                              }
                              else if (local_160 < 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x663,"ref_interp_seed_tree",
                                       "malloc send_node of REF_INT negative");
                                ref_interp_local._4_4_ = 1;
                              }
                              else {
                                recv_node = (REF_INT *)malloc((long)local_160 << 2);
                                if (recv_node == (REF_INT *)0x0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x663,"ref_interp_seed_tree",
                                         "malloc send_node of REF_INT NULL");
                                  ref_interp_local._4_4_ = 2;
                                }
                                else if (local_160 < 0) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x664,"ref_interp_seed_tree",
                                         "malloc send_proc of REF_INT negative");
                                  ref_interp_local._4_4_ = 1;
                                }
                                else {
                                  my_proc = (REF_INT *)malloc((long)local_160 << 2);
                                  if (my_proc == (REF_INT *)0x0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x664,"ref_interp_seed_tree",
                                           "malloc send_proc of REF_INT NULL");
                                    ref_interp_local._4_4_ = 2;
                                  }
                                  else if (local_160 < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                           ,0x665,"ref_interp_seed_tree",
                                           "malloc my_proc of REF_INT negative");
                                    ref_interp_local._4_4_ = 1;
                                  }
                                  else {
                                    recv_proc = (REF_INT *)malloc((long)local_160 << 2);
                                    if (recv_proc == (REF_INT *)0x0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                             ,0x665,"ref_interp_seed_tree",
                                             "malloc my_proc of REF_INT NULL");
                                      ref_interp_local._4_4_ = 2;
                                    }
                                    else {
                                      for (ref_private_macro_code_rss_7 = 0;
                                          ref_private_macro_code_rss_7 < local_160;
                                          ref_private_macro_code_rss_7 =
                                               ref_private_macro_code_rss_7 + 1) {
                                        recv_proc[ref_private_macro_code_rss_7] = ref_mpi_00->id;
                                      }
                                      local_160 = 0;
                                      for (best_node._4_4_ = 0; best_node._4_4_ < nrecv;
                                          best_node._4_4_ = best_node._4_4_ + 1) {
                                        if (ref_mpi_00->id ==
                                            *(int *)((long)best_bary + (long)best_node._4_4_ * 4)) {
                                          my_proc[local_160] = _nsend[best_node._4_4_];
                                          recv_node[local_160] = best_cell[best_node._4_4_];
                                          recv_cell[local_160] = from_proc[best_node._4_4_];
                                          if (recv_cell[local_160] != -1) {
                                            uVar2 = ref_cell_nodes(ref_cell,from_proc[best_node.
                                                                                      _4_4_],
                                                                   &local_f8);
                                            if (uVar2 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x671,"ref_interp_seed_tree",(ulong)uVar2,
                                                  "cell should be set and valid");
                                              printf("global %d best cell %d best bary %e\n",
                                                     _seed_target[best_node._4_4_],
                                                     (ulong)(uint)best_cell[best_node._4_4_],
                                                     (ulong)(uint)from_proc[best_node._4_4_]);
                                              return uVar2;
                                            }
                                            uVar2 = ref_node_bary4(ref_node,&local_f8,
                                                                   (REF_DBL *)
                                                                   (local_node +
                                                                   (long)(best_node._4_4_ * 3) * 2),
                                                                   recv_bary + (local_160 << 2));
                                            if (uVar2 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x674,"ref_interp_seed_tree",(ulong)uVar2,"bary")
                                              ;
                                              return uVar2;
                                            }
                                          }
                                          local_160 = local_160 + 1;
                                        }
                                      }
                                      ref_interp_local._4_4_ =
                                           ref_mpi_blindsend(ref_mpi_00,my_proc,recv_node,1,
                                                             local_160,&send_bary,
                                                             (REF_INT *)((long)&send_proc + 4),1);
                                      if (ref_interp_local._4_4_ == 0) {
                                        ref_interp_local._4_4_ =
                                             ref_mpi_blindsend(ref_mpi_00,my_proc,recv_cell,1,
                                                               local_160,&send_node,
                                                               (REF_INT *)((long)&send_proc + 4),1);
                                        if (ref_interp_local._4_4_ == 0) {
                                          ref_interp_local._4_4_ =
                                               ref_mpi_blindsend(ref_mpi_00,my_proc,recv_proc,1,
                                                                 local_160,&send_cell,
                                                                 (REF_INT *)((long)&send_proc + 4),1
                                                                );
                                          if (ref_interp_local._4_4_ == 0) {
                                            ref_interp_local._4_4_ =
                                                 ref_mpi_blindsend(ref_mpi_00,my_proc,recv_bary,4,
                                                                   local_160,(void **)&item,
                                                                   (REF_INT *)((long)&send_proc + 4)
                                                                   ,3);
                                            if (ref_interp_local._4_4_ == 0) {
                                              for (ref_private_macro_code_rss_1 = 0;
                                                  ref_private_macro_code_rss_1 < send_proc._4_4_;
                                                  ref_private_macro_code_rss_1 =
                                                       ref_private_macro_code_rss_1 + 1) {
                                                ref_interp->n_tree = ref_interp->n_tree + 1;
                                                best_node._4_4_ =
                                                     *(int *)((long)send_bary +
                                                             (long)ref_private_macro_code_rss_1 * 4)
                                                ;
                                                if ((long)ref_interp->cell[best_node._4_4_] != -1) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x689,"ref_interp_seed_tree",
                                                  "tree already found?",0xffffffffffffffff,
                                                  (long)ref_interp->cell[best_node._4_4_]);
                                                  return 1;
                                                }
                                                if (ref_interp->agent_hired[best_node._4_4_] != 0) {
                                                  uVar2 = ref_agents_delete(ref_interp->ref_agents,
                                                                            best_node._4_4_);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x68b,"ref_interp_seed_tree",(ulong)uVar2,"deq");
                                                  return uVar2;
                                                  }
                                                  ref_interp->agent_hired[best_node._4_4_] = 0;
                                                }
                                                ref_interp->cell[best_node._4_4_] =
                                                     send_node[ref_private_macro_code_rss_1];
                                                ref_interp->part[best_node._4_4_] =
                                                     send_cell[ref_private_macro_code_rss_1];
                                                if (send_node[ref_private_macro_code_rss_1] == -1) {
                                                  ref_interp->n_tree = ref_interp->n_tree + -1;
                                                }
                                                else {
                                                  for (ref_private_macro_code_rss = 0;
                                                      ref_private_macro_code_rss < 4;
                                                      ref_private_macro_code_rss =
                                                           ref_private_macro_code_rss + 1) {
                                                    ref_interp->bary
                                                    [ref_private_macro_code_rss +
                                                     best_node._4_4_ * 4] =
                                                         *(REF_DBL *)
                                                          ((long)_item +
                                                          (long)(ref_private_macro_code_rss +
                                                                ref_private_macro_code_rss_1 * 4) *
                                                          8);
                                                  }
                                                  uVar2 = ref_interp_push_onto_queue
                                                                    (ref_interp,best_node._4_4_);
                                                  if (uVar2 != 0) {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x693,"ref_interp_seed_tree",(ulong)uVar2,
                                                  "queue neighbors");
                                                  return uVar2;
                                                  }
                                                }
                                              }
                                              if (send_bary != (REF_DBL *)0x0) {
                                                free(send_bary);
                                              }
                                              if (send_node != (REF_INT *)0x0) {
                                                free(send_node);
                                              }
                                              if (send_cell != (REF_INT *)0x0) {
                                                free(send_cell);
                                              }
                                              if (_item != (void *)0x0) {
                                                free(_item);
                                              }
                                              if (recv_bary != (REF_DBL *)0x0) {
                                                free(recv_bary);
                                              }
                                              if (recv_proc != (REF_INT *)0x0) {
                                                free(recv_proc);
                                              }
                                              if (recv_cell != (REF_INT *)0x0) {
                                                free(recv_cell);
                                              }
                                              if (recv_node != (REF_INT *)0x0) {
                                                free(recv_node);
                                              }
                                              if (my_proc != (REF_INT *)0x0) {
                                                free(my_proc);
                                              }
                                              if (best_bary != (REF_DBL *)0x0) {
                                                free(best_bary);
                                              }
                                              if (from_proc != (REF_INT *)0x0) {
                                                free(from_proc);
                                              }
                                              if (best_cell != (REF_INT *)0x0) {
                                                free(best_cell);
                                              }
                                              if (_seed_target != (REF_DBL *)0x0) {
                                                free(_seed_target);
                                              }
                                              if (_nsend != (REF_INT *)0x0) {
                                                free(_nsend);
                                              }
                                              if (source != (REF_INT *)0x0) {
                                                free(source);
                                              }
                                              if (local_node != (REF_INT *)0x0) {
                                                free(local_node);
                                              }
                                              if (global_xyz != (REF_DBL *)0x0) {
                                                free(global_xyz);
                                              }
                                              if (global_node != (REF_INT *)0x0) {
                                                free(global_node);
                                              }
                                              ref_interp_local._4_4_ = ref_list_free(local_80);
                                              if (ref_interp_local._4_4_ == 0) {
                                                ref_interp_local._4_4_ = 0;
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x6af,"ref_interp_seed_tree",
                                                  (ulong)ref_interp_local._4_4_,"free list");
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x684,"ref_interp_seed_tree",
                                                  (ulong)ref_interp_local._4_4_,"blind send bary");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x681,"ref_interp_seed_tree",
                                                  (ulong)ref_interp_local._4_4_,"blind send proc");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                 ,0x67e,"ref_interp_seed_tree",
                                                 (ulong)ref_interp_local._4_4_,"blind send cell");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                               ,0x67b,"ref_interp_seed_tree",
                                               (ulong)ref_interp_local._4_4_,"blind send node");
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x65b,"ref_interp_seed_tree",(ulong)ref_interp_local._4_4_,"who");
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x63d,"ref_interp_seed_tree",(ulong)ref_interp_local._4_4_,"cat");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x639,"ref_interp_seed_tree",(ulong)ref_interp_local._4_4_,"cat");
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x60f,
           "ref_interp_seed_tree",(ulong)ref_interp_local._4_4_,"create list");
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget, seed_target, stride;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }

  /* use approximately 1 percent of existing targets sampled uniformly,
     between 10 or 100, less than or equal ntarget */
  seed_target = ntarget / 100;
  seed_target = MAX(seed_target, 10);
  seed_target = MIN(seed_target, 100);
  seed_target = MIN(seed_target, ntarget);
  if (seed_target > 0) {
    stride = 1 + ntarget / seed_target;
    seed_target = 0;
    for (node = 0; node < ntarget; node += stride) {
      local_node[seed_target] = local_node[node];
      local_xyz[0 + 3 * seed_target] = local_xyz[0 + 3 * node];
      local_xyz[1 + 3 * seed_target] = local_xyz[1 + 3 * node];
      local_xyz[2 + 3 * seed_target] = local_xyz[2 + 3 * node];
      seed_target++;
    }
    ntarget = seed_target;
  }

  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                           &(global_xyz[3 * node]),
                                           &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    } else {
      (ref_interp->n_tree)--;
    }
  }

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  return REF_SUCCESS;
}